

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O2

void c4mat_print_some(int m,int n,complex<float> *a,int ilo,int jlo,int ihi,int jhi,string *title)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int local_34;
  
  std::operator<<((ostream *)&std::cout,"\n");
  poVar6 = std::operator<<((ostream *)&std::cout,(string *)title);
  std::operator<<(poVar6,"\n");
  if (n < 1 || m < 1) {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  (None)\n");
    return;
  }
  local_34 = (jlo + -1) * m + -1;
  while( true ) {
    iVar3 = i4_min(jhi,n);
    if (iVar3 < jlo) break;
    iVar3 = i4_min(jlo + 3,n);
    iVar4 = i4_min(iVar3,jhi);
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  Col: ");
    for (iVar3 = jlo; iVar3 <= iVar4; iVar3 = iVar3 + 1) {
      poVar6 = std::operator<<((ostream *)&std::cout,"     ");
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 10;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      std::operator<<(poVar6,"     ");
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"  Row\n");
    std::operator<<((ostream *)&std::cout,"  ---\n");
    iVar3 = i4_max(ilo,1);
    iVar5 = i4_min(ihi,m);
    iVar8 = iVar3 + local_34;
    for (; iVar3 <= iVar5; iVar3 = iVar3 + 1) {
      *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 5;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::operator<<(poVar6,":");
      iVar7 = iVar8;
      for (lVar9 = 1; lVar9 <= (iVar4 - jlo) + 1; lVar9 = lVar9 + 1) {
        fVar1 = *(float *)&a[iVar7]._M_value;
        fVar2 = *(float *)((long)&a[iVar7]._M_value + 4);
        poVar6 = std::operator<<((ostream *)&std::cout,"  ");
        *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,fVar1);
        poVar6 = std::operator<<(poVar6,"  ");
        *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
        std::ostream::operator<<(poVar6,fVar2);
        iVar7 = iVar7 + m;
      }
      std::operator<<((ostream *)&std::cout,"\n");
      iVar8 = iVar8 + 1;
    }
    jlo = jlo + 4;
    local_34 = local_34 + m * 4;
  }
  return;
}

Assistant:

void c4mat_print_some ( int m, int n, complex <float> a[], int ilo, int jlo, 
  int ihi, int jhi, string title )

//****************************************************************************80
//
//  Purpose:
//
//    C4MAT_PRINT_SOME prints some of a C4MAT.
//
//  Discussion:
//
//    A C4MAT is an array of complex <float> values.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    20 April 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the matrix.
//
//    Input, complex <float> A[M*N], the matrix.
//
//    Input, int ILO, JLO, IHI, JHI, the first row and
//    column, and the last row and column to be printed.
//
//    Input, string TITLE, a title.
//
{
  complex <float> c;
  int i;
  int i2hi;
  int i2lo;
  int inc;
  int incx = 4;
  int j;
  int j2;
  int j2hi;
  int j2lo;

  cout << "\n";
  cout << title << "\n";

  if ( m <= 0 || n <= 0 )
  {
    cout << "\n";
    cout << "  (None)\n";
    return;
  }
//
//  Print the columns of the matrix, in strips of INCX.
//
  for ( j2lo = jlo; j2lo <= i4_min ( jhi, n ); j2lo = j2lo + incx )
  {
    j2hi = j2lo + incx - 1;
    j2hi = i4_min ( j2hi, n );
    j2hi = i4_min ( j2hi, jhi );

    inc = j2hi + 1 - j2lo;

    cout << "\n";
    cout << "  Col: ";
    for ( j = j2lo; j <= j2hi; j++ )
    {
      j2 = j + 1 - j2lo;
      cout << "     " << setw(10) << j << "     ";
    }
    cout << "\n";
    cout << "  Row\n";
    cout << "  ---\n";
//
//  Determine the range of the rows in this strip.
//
    i2lo = i4_max ( ilo, 1 );
    i2hi = i4_min ( ihi, m );

    for ( i = i2lo; i <= i2hi; i++ )
    {
      cout << setw(5) << i << ":";
//
//  Print out (up to) INCX entries in row I, that lie in the current strip.
//
      for ( j2 = 1; j2 <= inc; j2++ )
      {
        j = j2lo - 1 + j2;
        c = a[i-1+(j-1)*m];
        cout << "  " << setw(8) << real ( c )
             << "  " << setw(8) << imag ( c );
      }
      cout << "\n";
    }
  }

  return;
}